

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

string * __thiscall
Json::normalizeEOL_abi_cxx11_(string *__return_storage_ptr__,Json *this,Location begin,Location end)

{
  string *psVar1;
  Json *pJVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar1 = (string *)std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (this != (Json *)begin) {
    do {
      pJVar2 = this + 1;
      if (*this == (Json)0xd) {
        if ((pJVar2 != (Json *)begin) && (this[1] == (Json)0xa)) {
          pJVar2 = this + 2;
        }
        psVar1 = (string *)std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        psVar1 = (string *)std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      this = pJVar2;
    } while (pJVar2 != (Json *)begin);
  }
  return psVar1;
}

Assistant:

static std::string normalizeEOL(Reader::Location begin, Reader::Location end) {
  std::string normalized;
  normalized.reserve(end - begin);
  Reader::Location current = begin;
  while (current != end) {
    char c = *current++;
    if (c == '\r') {
      if (current != end && *current == '\n')
         // convert dos EOL
         ++current;
      // convert Mac EOL
      normalized += '\n';
    } else {
      normalized += c;
    }
  }
  return normalized;
}